

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

CharacterCounts __thiscall
ON_XMLNode::WriteFooterToStream
          (ON_XMLNode *this,wchar_t *stream,ON__UINT32 max_chars,bool includeFormatting,
          bool forceLongFormat)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  long *plVar6;
  wchar_t *__src;
  ulong uVar7;
  CharacterCounts CVar8;
  ON_wString footer;
  ON_wString local_40;
  wchar_t *local_38;
  
  local_38 = stream;
  iVar3 = (*this->_vptr_ON_XMLNode[0x22])();
  iVar4 = (*this->_vptr_ON_XMLNode[0x27])(this);
  plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x38))
                             ((long *)CONCAT44(extraout_var,iVar4));
  (**(code **)(*plVar6 + 0x168))(&local_40,plVar6);
  bVar2 = ON_wString::IsNotEmpty(&local_40);
  ON_wString::~ON_wString(&local_40);
  ON_wString::ON_wString(&local_40);
  if ((0 < iVar3) || (bVar2 || forceLongFormat)) {
    ON_wString::operator=(&local_40,L"</");
    ON_wString::operator+=(&local_40,&this->_private->m_name);
    ON_wString::operator+=(&local_40,L'>');
    if (includeFormatting) {
      ON_wString::operator+=(&local_40,L"\r\n");
      if (0 < iVar3) {
        iVar3 = (*this->_vptr_ON_XMLNode[0x23])(this);
        if (0 < iVar3) {
          ON_wString::Insert(&local_40,0,L'\t',iVar3);
        }
      }
    }
  }
  else {
    ON_wString::operator=(&local_40,L"/>");
    if (includeFormatting) {
      ON_wString::operator+=(&local_40,L"\r\n");
    }
  }
  uVar5 = ON_wString::Length(&local_40);
  if (max_chars == 0) {
    uVar7 = 0;
  }
  else {
    __src = ON_wString::operator_cast_to_wchar_t_(&local_40);
    uVar1 = uVar5 + 1;
    if (max_chars <= uVar5 + 1) {
      uVar1 = max_chars;
    }
    memcpy(local_38,__src,(ulong)uVar1 << 2);
    if (uVar5 < max_chars) {
      max_chars = uVar5;
    }
    uVar7 = (ulong)max_chars << 0x20;
  }
  ON_wString::~ON_wString(&local_40);
  CVar8._0_8_ = uVar5 | uVar7;
  CVar8._reserved = 0;
  return CVar8;
}

Assistant:

ON_XMLNode::CharacterCounts ON_XMLNode::WriteFooterToStream(wchar_t* stream, ON__UINT32 max_chars, bool includeFormatting, bool forceLongFormat) const
{
  const auto child_count = ChildCount();
  const bool hasDefaultProp = GetDefaultProperty().GetValue().AsString().IsNotEmpty();

  ON_wString footer;

  if (hasDefaultProp || (child_count > 0) || forceLongFormat)
  {
    footer = L"</";
    footer += _private->m_name;
    footer += L'>';

    if (includeFormatting)
    {
      footer += L"\r\n";

      if (child_count > 0)
      {
        const int depth = GetNestedDepth();
        if (depth > 0)
        {
          footer.Insert(0, L'\t', depth);
        }
      }
    }
  }
  else
  {
    footer = L"/>";
    if (includeFormatting)
      footer += L"\r\n";
  }

  CharacterCounts counts;
  counts._logical = ON__UINT32(footer.Length());

  if (0 != max_chars)
  {
    const auto chars_to_copy = std::min(max_chars, counts._logical + 1);
    memcpy(stream, static_cast<const wchar_t*>(footer), chars_to_copy * sizeof(wchar_t));
    counts._physical = std::min(max_chars, counts._logical);
  }

  return counts;
}